

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O0

void ryg_dxt::sInitDXT(void)

{
  int a;
  sInt sVar1;
  sInt unaff_retaddr;
  sInt v;
  sInt i_2;
  sInt i_1;
  sInt i;
  int local_c;
  int local_8;
  int local_4;
  
  for (local_4 = 0; local_4 < 0x20; local_4 = local_4 + 1) {
    Expand5[local_4] = (byte)(local_4 << 3) | (byte)(local_4 >> 2);
  }
  for (local_8 = 0; local_8 < 0x40; local_8 = local_8 + 1) {
    Expand6[local_8] = (byte)(local_8 << 2) | (byte)(local_8 >> 4);
  }
  for (local_c = 0; local_c < 0x110; local_c = local_c + 1) {
    a = sClamp<int>(local_c + -8,0,0xff);
    sVar1 = Mul8Bit(a,0x1f);
    QuantRBTab[local_c] = Expand5[sVar1];
    sVar1 = Mul8Bit(a,0x3f);
    QuantGTab[local_c] = Expand6[sVar1];
  }
  PrepareOptTable4(_i_1,_v,unaff_retaddr);
  PrepareOptTable4(_i_1,_v,unaff_retaddr);
  PrepareOptTable3(_i_1,_v,unaff_retaddr);
  PrepareOptTable3(_i_1,_v,unaff_retaddr);
  return;
}

Assistant:

void sInitDXT() {
  for (sInt i = 0; i < 32; i++)
    Expand5[i] = (i << 3) | (i >> 2);

  for (sInt i = 0; i < 64; i++)
    Expand6[i] = (i << 2) | (i >> 4);

  for (sInt i = 0; i < 256 + 16; i++) {
    sInt v = sClamp(i - 8, 0, 255);
    QuantRBTab[i] = Expand5[Mul8Bit(v, 31)];
    QuantGTab[i] = Expand6[Mul8Bit(v, 63)];
  }

  PrepareOptTable4(&OMatch5[0][0], Expand5, 32);
  PrepareOptTable4(&OMatch6[0][0], Expand6, 64);

  PrepareOptTable3(&OMatch5_3[0][0], Expand5, 32);
  PrepareOptTable3(&OMatch6_3[0][0], Expand6, 64);
}